

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O0

void ProcessReleaseList(SstStream Stream,ReturnMetadataInfo Metadata)

{
  long in_RSI;
  SstStream in_RDI;
  int j;
  SstStream unaff_retaddr;
  CPTimestepList List;
  int i;
  uint local_24;
  CPTimestepList local_20;
  int local_14;
  
  pthread_mutex_lock((pthread_mutex_t *)&in_RDI->DataLock);
  for (local_14 = 0; local_14 < *(int *)(in_RSI + 0x40); local_14 = local_14 + 1) {
    local_20 = in_RDI->QueuedTimesteps;
    CP_verbose(in_RDI,TraceVerbose,"Release List, TS %zd\n",
               *(undefined8 *)(*(long *)(in_RSI + 0x48) + (long)local_14 * 0x10));
    for (; local_20 != (CPTimestepList)0x0; local_20 = local_20->Next) {
      if (local_20->Timestep == *(long *)(*(long *)(in_RSI + 0x48) + (long)local_14 * 0x10)) {
        local_24 = 0;
        while (((int)local_24 < in_RDI->ReaderCount &&
               (in_RDI->Readers[(int)local_24]->RankZeroID !=
                *(void **)(*(long *)(in_RSI + 0x48) + (long)local_14 * 0x10 + 8)))) {
          local_24 = local_24 + 1;
        }
        if (in_RDI->Readers[(int)local_24]->LastReleasedTimestep < local_20->Timestep) {
          CP_verbose(in_RDI,TraceVerbose,"Updating reader %d last released to %zd\n",(ulong)local_24
                     ,local_20->Timestep);
          in_RDI->Readers[(int)local_24]->LastReleasedTimestep = local_20->Timestep;
        }
        CP_verbose(in_RDI,TraceVerbose,"Release List, and set ref count of timestep %zd\n",
                   *(undefined8 *)(*(long *)(in_RSI + 0x48) + (long)local_14 * 0x10));
        if (in_RDI->DP_Interface->readerReleaseTimestep != (CP_DP_PerReaderReleaseTimestepFunc)0x0)
        {
          (*in_RDI->DP_Interface->readerReleaseTimestep)
                    (&Svcs,in_RDI->Readers[(int)local_24]->DP_WSR_Stream,local_20->Timestep);
        }
        local_20->ReferenceCount = 0;
      }
    }
  }
  QueueMaintenance(unaff_retaddr);
  pthread_mutex_unlock((pthread_mutex_t *)&in_RDI->DataLock);
  return;
}

Assistant:

static void ProcessReleaseList(SstStream Stream, ReturnMetadataInfo Metadata)
{
    STREAM_MUTEX_LOCK(Stream);
    for (int i = 0; i < Metadata->ReleaseCount; i++)
    {
        CPTimestepList List = Stream->QueuedTimesteps;
        CP_verbose(Stream, TraceVerbose, "Release List, TS %zd\n",
                   Metadata->ReleaseList[i].Timestep);
        while (List)
        {
            if (List->Timestep == Metadata->ReleaseList[i].Timestep)
            {
                /* find local reader that matches global reader and notify local
                 * DP of release */
                int j;
                for (j = 0; j < Stream->ReaderCount; j++)
                {
                    if (Stream->Readers[j]->RankZeroID == Metadata->ReleaseList[i].Reader)
                    {
                        break;
                    }
                }
                assert(j < Stream->ReaderCount);
                if (List->Timestep > Stream->Readers[j]->LastReleasedTimestep)
                {
                    CP_verbose(Stream, TraceVerbose, "Updating reader %d last released to %zd\n", j,
                               List->Timestep);
                    Stream->Readers[j]->LastReleasedTimestep = List->Timestep;
                }
                CP_verbose(Stream, TraceVerbose,
                           "Release List, and set ref count of timestep %zd\n",
                           Metadata->ReleaseList[i].Timestep);
                /* per reader release here */
                if (Stream->DP_Interface->readerReleaseTimestep)
                {
                    (Stream->DP_Interface->readerReleaseTimestep)(
                        &Svcs, Stream->Readers[j]->DP_WSR_Stream, List->Timestep);
                }

                List->ReferenceCount = 0;
            }
            List = List->Next;
        }
    }
    QueueMaintenance(Stream);
    STREAM_MUTEX_UNLOCK(Stream);
}